

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.c
# Opt level: O0

void ht_hash_map_for_each
               (HT_HashMap *hash_map,_func_HT_Boolean_uint64_t_char_ptr_void_ptr *callback,void *ud)

{
  HT_Boolean HVar1;
  ulong local_28;
  size_t i;
  void *ud_local;
  _func_HT_Boolean_uint64_t_char_ptr_void_ptr *callback_local;
  HT_HashMap *hash_map_local;
  
  local_28 = 0;
  while ((local_28 < 0x200 &&
         (HVar1 = ht_hash_bucket_for_each(hash_map->buckets + local_28,callback,ud), HVar1 != 0))) {
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void ht_hash_map_for_each(HT_HashMap* hash_map, HT_Boolean(*callback)(uint64_t, const char*, void* ud), void* ud)
{
    for (size_t i = 0; i < BUCKET_COUNT(hash_map); i++)
    {
        if (!ht_hash_bucket_for_each(&hash_map->buckets[i], callback, ud))
        {
            return;
        }
    }
}